

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Random_keys.cpp
# Opt level: O2

int __thiscall Random_keys::avancaGeracoes2(Random_keys *this,Graph *g)

{
  vector<RK_Individual_*,_std::allocator<RK_Individual_*>_> *this_00;
  vector<RK_Individual_*,_std::allocator<RK_Individual_*>_> *this_01;
  double dVar1;
  value_type pRVar2;
  RK_Individual *pai1;
  RK_Individual *pai2;
  int iVar3;
  reference ppRVar4;
  uint uVar5;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  Random_keys *pRVar10;
  int iVar11;
  size_type sVar12;
  uint uVar13;
  int iVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double local_78;
  ulong uVar6;
  
  this_00 = &this->popAtual;
  ppRVar4 = std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::at
                      (this_00,(long)this->tamPop - 1);
  pRVar2 = *ppRVar4;
  ordenaPopulacaoAtual(this,g);
  this_01 = &this->popAnterior;
  iVar14 = 0;
  iVar11 = 0;
  local_78 = pRVar2->active_loss * 100000.0;
  while( true ) {
    iVar3 = this->numGeracoes;
    ordenaPopulacaoAtual(this,g);
    if (iVar3 <= iVar14) break;
    ppRVar4 = std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::at
                        (this_00,(long)this->tamPop - 1);
    dVar15 = (*ppRVar4)->active_loss * 100000.0;
    dVar16 = dVar15;
    if (local_78 <= dVar15) {
      dVar16 = local_78;
    }
    std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::operator=(this_01,this_00);
    iVar3 = this->tamPop;
    dVar17 = (double)iVar3;
    uVar5 = (uint)(dVar17 * 0.05);
    uVar6 = (ulong)uVar5;
    for (sVar12 = (size_type)(int)uVar5; (long)sVar12 < (long)(iVar3 - (int)(dVar17 * 0.1));
        sVar12 = sVar12 + 1) {
      rand();
      iVar3 = rand();
      uVar8 = iVar3 % this->tamPop;
      iVar3 = rand();
      uVar13 = iVar3 % this->tamPop;
      iVar3 = rand();
      uVar7 = iVar3 % this->tamPop;
      ppRVar4 = std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::at
                          (this_01,(long)(int)uVar8);
      dVar1 = (*ppRVar4)->active_loss;
      ppRVar4 = std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::at
                          (this_01,(long)(int)uVar13);
      if (dVar1 < (*ppRVar4)->active_loss) {
        uVar13 = uVar8;
      }
      ppRVar4 = std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::at
                          (this_01,(long)(int)uVar13);
      dVar1 = (*ppRVar4)->active_loss;
      ppRVar4 = std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::at
                          (this_01,(long)(int)uVar7);
      if (dVar1 < (*ppRVar4)->active_loss) {
        uVar7 = uVar13;
      }
      uVar9 = (ulong)uVar7;
      while ((uint)uVar9 == uVar7) {
        iVar3 = rand();
        uVar9 = (long)iVar3 % (long)this->tamPop & 0xffffffff;
      }
      ppRVar4 = std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::at
                          (this_01,(long)(int)uVar7);
      pai1 = *ppRVar4;
      ppRVar4 = std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::at
                          (this_01,(long)(int)(uint)uVar9);
      pai2 = *ppRVar4;
      pRVar10 = (Random_keys *)this_00;
      ppRVar4 = std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::at(this_00,sVar12);
      cruzamento2(pRVar10,pai1,pai2,*ppRVar4);
      pRVar10 = (Random_keys *)this_00;
      ppRVar4 = std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::at(this_00,sVar12);
      mutacao(pRVar10,*ppRVar4);
      iVar3 = this->tamPop;
    }
    if ((int)uVar5 < 1) {
      uVar6 = 0;
    }
    for (sVar12 = 0; uVar6 != sVar12; sVar12 = sVar12 + 1) {
      ppRVar4 = std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::at(this_00,sVar12);
      RK_Individual::generate_random_weights(*ppRVar4);
    }
    if (dVar15 < local_78) {
      iVar11 = iVar14;
    }
    iVar14 = iVar14 + 1;
    local_78 = dVar16;
  }
  return iVar11;
}

Assistant:

int Random_keys::avancaGeracoes2(Graph *g){

    int melhorGeracao = 0;
    RK_Individual *best = popAtual.at(this->tamPop - 1);
    this->ordenaPopulacaoAtual(g);
    double perda = 100*1000*best->getActiveLoss();
    for(int k=0; k<this->numGeracoes; k++){

        /** calcula a funcao criterio para cada individuo
         e ordena a populacao da maior perda(pior individuo)
         pra menor perda(melhor individuo), perdaAtiva**/
        this->ordenaPopulacaoAtual(g);

        RK_Individual *best = popAtual.at(this->tamPop - 1);
        if (100*1000*best->getActiveLoss() < perda){
            perda = 100*1000*best->getActiveLoss();
//            printf("\ngeracao (%d)  melhor individuo: %lf kw", k, 100*1000*best->getPerdaAtiva());//resultado ja em kw
            melhorGeracao = k;
        }

        popAnterior = popAtual;

        int num_piores = 0.05*this->tamPop;
        int num_melhores = 0.1*this->tamPop;

        for(int i=num_piores; i<this->tamPop-num_melhores; i++){

            /** cruzamento entre pai1 e pai2 entre os
            individuos aleatorios da populacao anterior
            modificar por uma escolha em roleta no futuro**/
            int pai1 = rand() % this->tamPop;
//            int pai2 = rand() % this->tamPop; //aleatorio

            /*torneio com 3*/
            int cand1, cand2, cand3;
            cand1 = rand() % this->tamPop;
            cand2 = rand() % this->tamPop;
            cand3 = rand() % this->tamPop;

            int aux = cand1;

            if(popAnterior.at(cand1)->getActiveLoss() < popAnterior.at(cand2)->getActiveLoss()){
                cand2=cand1;
            }else{aux = cand2;}
            if(popAnterior.at(cand2)->getActiveLoss() < popAnterior.at(cand3)->getActiveLoss()){
                cand3=cand2;
            }else{aux = cand3;}
            pai1 = aux;

            int pai2 = cand3;

            while(pai2==pai1)
                pai2 = rand() % this->tamPop;

//            popAnterior.at(pai1)->cruzamentoMedia2(popAnterior.at(pai2), popAtual.at(i));
            this->cruzamento2(popAnterior.at(pai1), popAnterior.at(pai2), popAtual.at(i));
//            popAtual.at(i)->mutacao();
            this->mutacao(popAtual.at(i));
        }

        /**aleatorio ao inves de manter piores**/
        for(int i=0; i<num_piores; i++)
            popAtual.at(i)->generate_random_weights();
    }

//    cout << "\n--------------------------------------"<<endl;
//    for(unsigned int i=0; i<popAtual.size(); i++)
//        cout << 100*1000*popAtual.at(i)->getPerdaAtiva() << " , ";
//    cout << "\n--------------------------------------"<<endl;

    this->ordenaPopulacaoAtual(g);

    return melhorGeracao;
}